

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_resume_data(nghttp2_session *session,int32_t stream_id)

{
  int iVar1;
  nghttp2_stream *stream;
  int iVar2;
  
  stream = (nghttp2_stream *)nghttp2_map_find(&session->streams,stream_id);
  if ((stream == (nghttp2_stream *)0x0) || ((stream->flags & 2) != 0)) {
    stream = (nghttp2_stream *)0x0;
  }
  else if (stream->state == NGHTTP2_STREAM_IDLE) {
    stream = (nghttp2_stream *)0x0;
  }
  iVar2 = -0x1f5;
  if ((stream != (nghttp2_stream *)0x0) &&
     (iVar1 = nghttp2_stream_check_deferred_item(stream), iVar1 != 0)) {
    iVar1 = session_resume_deferred_stream_item(session,stream,'\b');
    iVar2 = 0;
    if (iVar1 < -900) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

int nghttp2_session_resume_data(nghttp2_session *session, int32_t stream_id) {
  int rv;
  nghttp2_stream *stream;
  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream == NULL || !nghttp2_stream_check_deferred_item(stream)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  rv = session_resume_deferred_stream_item(session, stream,
                                           NGHTTP2_STREAM_FLAG_DEFERRED_USER);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return 0;
}